

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

void __thiscall
SharedPtrTests_misc_ResetEmpty_Test::TestBody(SharedPtrTests_misc_ResetEmpty_Test *this)

{
  bool bVar1;
  int *ptr;
  char *pcVar2;
  AssertHelper local_d8;
  Message local_d0;
  int local_c4;
  size_t local_c0;
  undefined1 local_b8 [8];
  AssertionResult gtest_ar_2;
  Message local_a0;
  int local_94;
  size_t local_90;
  undefined1 local_88 [8];
  AssertionResult gtest_ar_1;
  Message local_70;
  void *local_68;
  int *local_60;
  undefined1 local_58 [8];
  AssertionResult gtest_ar;
  undefined1 local_38 [8];
  SharedPtr<int> t2;
  SharedPtr<int> t1;
  int *a;
  SharedPtrTests_misc_ResetEmpty_Test *this_local;
  
  ptr = (int *)operator_new(4);
  *ptr = 0x4d2;
  SharedPtr<int>::SharedPtr((SharedPtr<int> *)&t2.pointersAmount,ptr);
  SharedPtr<int>::SharedPtr((SharedPtr<int> *)local_38,(SharedPtr<int> *)&t2.pointersAmount);
  SharedPtr<int>::reset((SharedPtr<int> *)&t2.pointersAmount,(int *)0x0);
  local_60 = SharedPtr<int>::get((SharedPtr<int> *)&t2.pointersAmount);
  local_68 = (void *)0x0;
  testing::internal::EqHelper<false>::Compare<int*,decltype(nullptr)>
            ((EqHelper<false> *)local_58,"t1.get()","nullptr",&local_60,&local_68);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_58);
  if (!bVar1) {
    testing::Message::Message(&local_70);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_58);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/NickTikhomirov[P]AYA3_3/tests/test.cpp"
               ,0x59,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_70);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_70);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_58);
  local_90 = SharedPtr<int>::use_count((SharedPtr<int> *)&t2.pointersAmount);
  local_94 = 1;
  testing::internal::EqHelper<false>::Compare<unsigned_long,int>
            ((EqHelper<false> *)local_88,"t1.use_count()","1",&local_90,&local_94);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_88);
  if (!bVar1) {
    testing::Message::Message(&local_a0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_88);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/NickTikhomirov[P]AYA3_3/tests/test.cpp"
               ,0x5a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_88);
  local_c0 = SharedPtr<int>::use_count((SharedPtr<int> *)local_38);
  local_c4 = 1;
  testing::internal::EqHelper<false>::Compare<unsigned_long,int>
            ((EqHelper<false> *)local_b8,"t2.use_count()","1",&local_c0,&local_c4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b8);
  if (!bVar1) {
    testing::Message::Message(&local_d0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_b8);
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/NickTikhomirov[P]AYA3_3/tests/test.cpp"
               ,0x5b,pcVar2);
    testing::internal::AssertHelper::operator=(&local_d8,&local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    testing::Message::~Message(&local_d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b8);
  SharedPtr<int>::~SharedPtr((SharedPtr<int> *)local_38);
  SharedPtr<int>::~SharedPtr((SharedPtr<int> *)&t2.pointersAmount);
  return;
}

Assistant:

TEST(SharedPtrTests_misc, ResetEmpty) {
	int* a;
	a = new int;
	*a = 1234;
	SharedPtr<int> t1(a);
	SharedPtr<int> t2(t1);
	t1.reset();
	EXPECT_EQ(t1.get(), nullptr);
	EXPECT_EQ(t1.use_count(),1);
	EXPECT_EQ(t2.use_count(),1);
}